

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DwaCompressor::setupChannelData(DwaCompressor *this,int minX,int minY,int maxX,int maxY)

{
  char *pcVar1;
  int i;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pCVar8;
  long lVar9;
  char *planarUncBuffer [3];
  long alStack_48 [3];
  
  lVar5 = 0;
  do {
    alStack_48[lVar5] = (long)this->_planarUncBuffer[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  pCVar8 = (this->_channelData).
           super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_channelData).
      super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar8) {
    uVar7 = 0;
    do {
      iVar2 = numSamples(pCVar8[uVar7].xSampling,minX,maxX);
      pCVar8[uVar7].width = iVar2;
      iVar3 = numSamples(pCVar8[uVar7].ySampling,minY,maxY);
      pCVar8[uVar7].height = iVar3;
      iVar2 = pCVar8[uVar7].width;
      iVar4 = pixelTypeSize(pCVar8[uVar7].type);
      pCVar8[uVar7].planarUncSize = iVar4 * iVar3 * iVar2;
      pcVar1 = (char *)alStack_48[pCVar8[uVar7].compression];
      pCVar8[uVar7].planarUncBuffer = pcVar1;
      pCVar8[uVar7].planarUncBufferEnd = pcVar1;
      pCVar8[uVar7].planarUncRle[0] = pcVar1;
      pCVar8[uVar7].planarUncRleEnd[0] = pcVar1;
      iVar2 = pixelTypeSize(pCVar8[uVar7].type);
      if (1 < iVar2) {
        lVar5 = 10;
        do {
          iVar2 = pCVar8[uVar7].width;
          iVar3 = pCVar8[uVar7].height;
          pcVar1 = pCVar8[uVar7].planarUncRle[lVar5 + -10];
          pCVar8[uVar7].planarUncRle[lVar5 + -9] = pcVar1 + (long)iVar3 * (long)iVar2;
          pCVar8[uVar7].planarUncRle[lVar5 + -5] = pcVar1 + (long)iVar3 * (long)iVar2;
          iVar2 = pixelTypeSize(pCVar8[uVar7].type);
          lVar9 = lVar5 + -8;
          lVar5 = lVar5 + 1;
        } while (lVar9 < iVar2);
      }
      pCVar8[uVar7].planarUncType = pCVar8[uVar7].type;
      if (pCVar8[uVar7].compression == LOSSY_DCT) {
        pCVar8[uVar7].planarUncType = FLOAT;
      }
      else {
        iVar2 = pCVar8[uVar7].height;
        iVar3 = pCVar8[uVar7].width;
        iVar4 = pixelTypeSize(pCVar8[uVar7].type);
        alStack_48[pCVar8[uVar7].compression] =
             alStack_48[pCVar8[uVar7].compression] + (long)(iVar4 * iVar2 * iVar3);
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      pCVar8 = (this->_channelData).
               super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->_channelData).
                     super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar8 >> 3) *
              -0x79435e50d79435e5;
    } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
  }
  return;
}

Assistant:

void
DwaCompressor::setupChannelData (int minX, int minY, int maxX, int maxY)
{
    char *planarUncBuffer[NUM_COMPRESSOR_SCHEMES];

    for (int i=0; i<NUM_COMPRESSOR_SCHEMES; ++i)
    {
        planarUncBuffer[i] = 0;

        if (_planarUncBuffer[i])
            planarUncBuffer[i] =  _planarUncBuffer[i];
    }

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        ChannelData *cd = &_channelData[chan];

        cd->width  = OPENEXR_IMF_NAMESPACE::numSamples (cd->xSampling, minX, maxX);
        cd->height = OPENEXR_IMF_NAMESPACE::numSamples (cd->ySampling, minY, maxY);
                                
        cd->planarUncSize =
            cd->width * cd->height * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
                                  
        cd->planarUncBuffer    = planarUncBuffer[cd->compression];
        cd->planarUncBufferEnd = cd->planarUncBuffer;

        cd->planarUncRle[0]    = cd->planarUncBuffer;
        cd->planarUncRleEnd[0] = cd->planarUncRle[0];

        for (int byte = 1; byte < OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type); ++byte)
        {
            cd->planarUncRle[byte] = 
                         cd->planarUncRle[byte-1] + cd->width * cd->height;

            cd->planarUncRleEnd[byte] =
                         cd->planarUncRle[byte];
        }

        cd->planarUncType = cd->type;

        if (cd->compression == LOSSY_DCT)
        {
            cd->planarUncType = FLOAT;
        }
        else
        {
            planarUncBuffer[cd->compression] +=
                cd->width * cd->height * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->planarUncType);
        }
    }
}